

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_ulong.c
# Opt level: O2

uint scan_ulong(char *s,unsigned_long *u)

{
  uint uVar1;
  unsigned_long uVar2;
  
  uVar2 = 0;
  uVar1 = 0;
  while( true ) {
    if (9 < (byte)(s[uVar1] - 0x30U)) break;
    uVar2 = uVar2 * 10 + (ulong)(byte)(s[uVar1] - 0x30U);
    uVar1 = uVar1 + 1;
  }
  *u = uVar2;
  return uVar1;
}

Assistant:

unsigned int scan_ulong(register const char *s,register unsigned long *u)
{
  register unsigned int pos = 0;
  register unsigned long result = 0;
  register unsigned long c;
  while ((c = (unsigned long) (unsigned char) (s[pos] - '0')) < 10) {
    result = result * 10 + c;
    ++pos;
  }
  *u = result;
  return pos;
}